

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::copy_make_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int type,float v)

{
  int iVar1;
  bool bVar2;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  Mat borderm;
  Mat m;
  int q;
  int channels;
  int h;
  int w;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Mat *in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  Mat *in_stack_ffffffffffffff98;
  Mat *in_stack_ffffffffffffffa0;
  int local_34;
  
  if ((*(int *)(in_RDI + 0x1c) + in_R8D + in_R9D == *(int *)(in_RDI + 0x1c)) &&
     (*(int *)(in_RDI + 0x20) + in_EDX + in_ECX == *(int *)(in_RDI + 0x20))) {
    Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  else if (*(int *)(in_RDI + 0x18) == 2) {
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (!bVar2) {
      copy_make_border_image
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    }
  }
  else if (*(int *)(in_RDI + 0x18) == 3) {
    iVar1 = *(int *)(in_RDI + 0x24);
    Mat::create(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                in_stack_ffffffffffffff74,
                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (!bVar2) {
      for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff64);
        Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff64);
        copy_make_border_image
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                   in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
        Mat::~Mat((Mat *)0x14f0a6);
        Mat::~Mat((Mat *)0x14f0b0);
      }
    }
  }
  return;
}

Assistant:

void copy_make_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int type, float v)
{
    int w = src.w + left + right;
    int h = src.h + top + bottom;

    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h);
        if (dst.empty())
            return;

        copy_make_border_image(src, dst, top, left, type, v);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat borderm = dst.channel(q);

            copy_make_border_image(m, borderm, top, left, type, v);
        }
    }
}